

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cache.h
# Opt level: O3

void __thiscall
JsUtil::MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler>::
MRURetentionPolicy(MRURetentionPolicy<Js::EvalMapStringInternal<false>,_15,_Memory::Recycler> *this,
                  Recycler *allocator)

{
  undefined8 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Recycler *this_00;
  undefined4 *puVar5;
  CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *pCVar6;
  long lVar7;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  (this->store).ptr = (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *)0x0
  ;
  local_48 = (undefined1  [8])
             &CircularBuffer<Js::EvalMapStringInternal<false>,15u,Memory::Recycler>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_2da4fa8;
  data.filename._0_4_ = 0x66;
  this_00 = Memory::Recycler::TrackAllocInfo(allocator,(TrackAllocData *)local_48);
  BVar4 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar4 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1ef,"(ExceptionCheck::CanHandleOutOfMemory())",
                       "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar3) goto LAB_0079b977;
    *puVar5 = 0;
  }
  pCVar6 = (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *)
           Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                     (this_00,0x260);
  if (pCVar6 == (CircularBuffer<Js::EvalMapStringInternal<false>,_15U,_Memory::Recycler> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                       ,0x1f2,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar3) {
LAB_0079b977:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pCVar6->writeIndex = 0;
  pCVar6->filled = false;
  lVar7 = 0x20;
  do {
    puVar1 = (undefined8 *)((long)pCVar6->entries + lVar7 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined4 *)((long)pCVar6->entries + lVar7 + -0x10) = 0xffffffff;
    puVar1 = (undefined8 *)((long)pCVar6->entries + lVar7 + -8);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar7 = lVar7 + 0x28;
  } while (lVar7 != 0x278);
  Memory::Recycler::WBSetBit((char *)this);
  (this->store).ptr = pCVar6;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
  return;
}

Assistant:

MRURetentionPolicy(TAllocator* allocator)
        {
            store = AllocatorNew(TAllocator, allocator, TMRUStoreType);
        }